

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
::reset(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
        *this)

{
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::clear();
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x1ee6ff);
  std::char_traits<char>::to_char_type
            ((int_type *)
             &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x14);
  std::vector<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reset() noexcept
    {
        token_buffer.clear();
        token_string.clear();
        token_string.push_back(char_traits<char_type>::to_char_type(current));
    }